

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::getPartialStates(Synth *this,Bit8u *partialStates)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Partial *this_00;
  TVA *this_01;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  uint partialNum;
  
  if (this->opened != true) {
    memset(partialStates,0,(ulong)(this->partialCount + 3 >> 2));
    return;
  }
  if (this->partialCount != 0) {
    iVar5 = 0;
    uVar4 = 0;
    do {
      bVar7 = 0;
      bVar9 = 0;
      uVar8 = 0;
      do {
        partialNum = iVar5 + uVar8;
        uVar1 = this->partialCount;
        if (partialNum < uVar1) {
          this_00 = PartialManager::getPartial(this->partialManager,partialNum);
          bVar2 = Partial::isActive(this_00);
          uVar6 = 0;
          if (bVar2) {
            this_01 = Partial::getTVA(this_00);
            iVar3 = TVA::getPhase(this_01);
            uVar6 = *(uint *)(PARTIAL_PHASE_TO_STATE + (long)iVar3 * 4) & 3;
          }
          bVar9 = bVar9 | (byte)(uVar6 << (bVar7 & 0x1f));
        }
        if (uVar1 <= partialNum) break;
        bVar7 = bVar7 + 2;
        bVar2 = uVar8 < 3;
        uVar8 = uVar8 + 1;
      } while (bVar2);
      iVar3 = (int)uVar4;
      partialStates[uVar4] = bVar9;
      uVar4 = (ulong)(iVar3 + 1);
      iVar5 = iVar5 + 4;
    } while (iVar3 * 4 + 4U < this->partialCount);
  }
  return;
}

Assistant:

void Synth::getPartialStates(Bit8u *partialStates) const {
	if (!opened) {
		memset(partialStates, 0, ((partialCount + 3) >> 2));
		return;
	}
	for (unsigned int quartNum = 0; (4 * quartNum) < partialCount; quartNum++) {
		Bit8u packedStates = 0;
		for (unsigned int i = 0; i < 4; i++) {
			unsigned int partialNum = (4 * quartNum) + i;
			if (partialCount <= partialNum) break;
			PartialState partialState = getPartialState(partialManager, partialNum);
			packedStates |= (partialState & 3) << (2 * i);
		}
		partialStates[quartNum] = packedStates;
	}
}